

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_tcp_socket.c
# Opt level: O1

int amqp_tcp_socket_close(void *base)

{
  int iVar1;
  int iVar2;
  
  iVar1 = 0;
  if (*(int *)((long)base + 8) != -1) {
    iVar2 = amqp_os_socket_close(*(int *)((long)base + 8));
    iVar1 = -9;
    if (iVar2 == 0) {
      *(undefined4 *)((long)base + 8) = 0xffffffff;
      iVar1 = 0;
    }
  }
  return iVar1;
}

Assistant:

static int
amqp_tcp_socket_close(void *base)
{
  struct amqp_tcp_socket_t *self = (struct amqp_tcp_socket_t *)base;

  if (-1 != self->sockfd) {
    if (amqp_os_socket_close(self->sockfd)) {
      return AMQP_STATUS_SOCKET_ERROR;
    }
    self->sockfd = -1;
  }

  return AMQP_STATUS_OK;
}